

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

BBox * __thiscall CMU462::DynamicScene::Scene::get_bbox(Scene *this)

{
  bool bVar1;
  reference ppSVar2;
  long in_RSI;
  BBox *in_RDI;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  BBox *bbox;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_stack_ffffffffffffff68;
  BBox *this_00;
  BBox *in_stack_ffffffffffffff88;
  BBox *in_stack_ffffffffffffff90;
  BBox *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  long local_18;
  
  this_00 = in_RDI;
  BBox::BBox(in_stack_ffffffffffffffd0);
  local_18 = in_RSI + 0x98;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_ffffffffffffff68);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)this_00);
    (*(*ppSVar2)->_vptr_SceneObject[4])(&stack0xffffffffffffff88);
    BBox::expand(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)this_00);
  }
  return in_RDI;
}

Assistant:

BBox Scene::get_bbox() {
  BBox bbox;
  for (SceneObject *obj : objects) {
    bbox.expand(obj->get_bbox());
  }
  return bbox;
}